

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_ManTimeExpand(Abc_ManTime_t *p,int nSize,int fProgressive)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  long lVar4;
  size_t sVar5;
  uint nCapMin;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_t __size;
  
  pVVar2 = p->vArrs;
  iVar1 = pVVar2->nSize;
  lVar7 = (long)iVar1;
  if (iVar1 < nSize) {
    uVar6 = nSize << (fProgressive != 0);
    nCapMin = 100;
    if (100 < (int)uVar6) {
      nCapMin = uVar6;
    }
    Vec_PtrGrow(pVVar2,nCapMin);
    pVVar2->nSize = nCapMin;
    uVar8 = (ulong)nCapMin;
    if ((iVar1 == 0) || (*pVVar2->pArray == (void *)0x0)) {
      pvVar3 = malloc(uVar8 * 8);
    }
    else {
      pvVar3 = realloc(*pVVar2->pArray,uVar8 * 8);
    }
    __size = uVar8 << 3;
    for (sVar5 = 0; lVar4 = lVar7, __size != sVar5; sVar5 = sVar5 + 8) {
      *(size_t *)((long)pVVar2->pArray + sVar5) = (long)pvVar3 + sVar5;
    }
    for (; lVar4 < (long)uVar8; lVar4 = lVar4 + 1) {
      *(undefined8 *)pVVar2->pArray[lVar4] = 0xce6e6b28ce6e6b28;
    }
    pVVar2 = p->vReqs;
    Vec_PtrGrow(pVVar2,nCapMin);
    pVVar2->nSize = nCapMin;
    if ((iVar1 == 0) || (*pVVar2->pArray == (void *)0x0)) {
      pvVar3 = malloc(__size);
    }
    else {
      pvVar3 = realloc(*pVVar2->pArray,__size);
    }
    for (sVar5 = 0; __size != sVar5; sVar5 = sVar5 + 8) {
      *(size_t *)((long)pVVar2->pArray + sVar5) = (long)pvVar3 + sVar5;
    }
    for (; lVar7 < (long)uVar8; lVar7 = lVar7 + 1) {
      builtin_strncpy((char *)pVVar2->pArray[lVar7],"(knN(knN",8);
    }
  }
  return;
}

Assistant:

void Abc_ManTimeExpand( Abc_ManTime_t * p, int nSize, int fProgressive )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * ppTimes, * ppTimesOld, * pTime;
    int nSizeOld, nSizeNew, i;

    nSizeOld = p->vArrs->nSize;
    if ( nSizeOld >= nSize )
        return;
    nSizeNew = fProgressive? 2 * nSize : nSize;
    if ( nSizeNew < 100 )
        nSizeNew = 100;

    vTimes = p->vArrs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = -ABC_INFINITY;
        pTime->Fall  = -ABC_INFINITY;
    }

    vTimes = p->vReqs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = ABC_INFINITY;
        pTime->Fall  = ABC_INFINITY;
    }
}